

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quaternion.cpp
# Opt level: O2

quaternion_t * opengv::math::rot2quaternion(quaternion_t *__return_storage_ptr__,rotation_t *R)

{
  undefined1 auVar1 [16];
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  double dVar36;
  double dVar37;
  double dVar38;
  double __x;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  
  dVar38 = (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
           [0];
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar38;
  dVar7 = (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [4];
  dVar36 = (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
           [8];
  auVar5._8_8_ = 0x8000000000000000;
  auVar5._0_8_ = 0x8000000000000000;
  auVar5 = vxorpd_avx512vl(auVar31,auVar5);
  dVar37 = (dVar38 + dVar7 + dVar36 + 1.0) * 0.25;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar37;
  __x = (((dVar7 - dVar38) - dVar36) + 1.0) * 0.25;
  dVar2 = ((auVar5._0_8_ - dVar7) + dVar36 + 1.0) * 0.25;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.
  m_data.array[3] = dVar2;
  if (dVar37 < 0.0) {
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage
    .m_data.array[0] = 0.0;
    auVar8 = ZEXT816(0);
  }
  if (__x < 0.0) {
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage
    .m_data.array[2] = 0.0;
    __x = 0.0;
  }
  auVar5 = ZEXT816(0);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = (((dVar38 - dVar7) - dVar36) + 1.0) * 0.25;
  auVar6 = vmaxsd_avx(ZEXT816(0),auVar18);
  if (auVar8._0_8_ < 0.0) {
    auVar14._0_8_ = sqrt(auVar8._0_8_);
    auVar14._8_56_ = extraout_var;
    auVar8 = auVar14._0_16_;
    auVar6._8_8_ = 0;
    auVar5 = SUB6416(ZEXT864(0),0) << 0x40;
  }
  else {
    auVar8 = vsqrtsd_avx(auVar8,auVar8);
  }
  if (auVar6._0_8_ < 0.0) {
    auVar15._0_8_ = sqrt(auVar6._0_8_);
    auVar15._8_56_ = extraout_var_00;
    auVar31 = auVar15._0_16_;
    auVar5 = ZEXT816(0) << 0x40;
  }
  else {
    auVar31 = vsqrtsd_avx(auVar6,auVar6);
  }
  auVar19._8_8_ = 0;
  auVar19._0_8_ = __x;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = dVar2;
  auVar26 = vmaxsd_avx(auVar5,auVar1);
  if (__x < 0.0) {
    auVar16._0_8_ = sqrt(__x);
    auVar16._8_56_ = extraout_var_01;
    auVar26._8_8_ = 0;
    auVar5 = auVar16._0_16_;
  }
  else {
    auVar5 = vsqrtsd_avx(auVar19,auVar19);
  }
  if (auVar26._0_8_ < 0.0) {
    auVar17._0_8_ = sqrt(auVar26._0_8_);
    auVar17._8_56_ = extraout_var_02;
    auVar6 = auVar17._0_16_;
  }
  else {
    auVar6 = vsqrtsd_avx(auVar26,auVar26);
  }
  dVar36 = auVar8._0_8_;
  dVar38 = auVar31._0_8_;
  dVar37 = auVar5._0_8_;
  dVar7 = auVar6._0_8_;
  if (((dVar36 < dVar38) || (dVar36 < dVar37)) || (dVar36 < dVar7)) {
    if (((dVar38 < dVar36) || (dVar38 < dVar37)) || (dVar38 < dVar7)) {
      if (((dVar37 < dVar36) || (dVar37 < dVar38)) || (dVar37 < dVar7)) {
        auVar25 = vunpcklpd_avx(auVar8,auVar31);
        auVar29 = vunpcklpd_avx(auVar5,auVar6);
        if (((dVar36 <= dVar7) && (dVar38 <= dVar7)) && (dVar37 <= dVar7)) {
          auVar5 = *(undefined1 (*) [16])
                    ((R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                     m_data.array + 1);
          auVar8 = vsubpd_avx(auVar5,*(undefined1 (*) [16])
                                      ((R->
                                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                       .m_storage.m_data.array + 3));
          dVar38 = (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[6];
          auVar4._8_8_ = dVar38;
          auVar4._0_8_ = dVar38;
          auVar5 = vaddpd_avx512vl(auVar5,auVar4);
          auVar12._8_8_ = auVar5._8_8_;
          auVar12._0_8_ = auVar8._0_8_;
          auVar35._8_8_ = 0x7fffffffffffffff;
          auVar35._0_8_ = 0x7fffffffffffffff;
          auVar5 = vandpd_avx(auVar12,auVar35);
          auVar5 = vdivpd_avx(auVar12,auVar5);
          dVar38 = auVar25._8_8_;
          auVar25._0_8_ = auVar25._0_8_ * auVar5._0_8_;
          auVar25._8_8_ = dVar38 * auVar5._8_8_;
          dVar38 = (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[5] +
                   (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[7];
          auVar13._8_8_ = 0;
          auVar13._0_8_ = dVar38;
          auVar5 = vandpd_avx(auVar13,auVar35);
          auVar29._0_8_ = dVar37 * (dVar38 / auVar5._0_8_);
        }
      }
      else {
        auVar6 = *(undefined1 (*) [16])
                  ((R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array + 2);
        auVar18 = vsubpd_avx(*(undefined1 (*) [16])
                              ((R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array + 6),auVar6);
        dVar38 = (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                 array[1];
        auVar3._8_8_ = dVar38;
        auVar3._0_8_ = dVar38;
        auVar6 = vaddpd_avx512vl(auVar6,auVar3);
        auVar24._0_8_ = auVar18._0_8_;
        auVar24._8_8_ = auVar6._8_8_;
        auVar30._8_8_ = 0x7fffffffffffffff;
        auVar30._0_8_ = 0x7fffffffffffffff;
        auVar6 = vandpd_avx(auVar24,auVar30);
        auVar6 = vdivpd_avx(auVar24,auVar6);
        auVar8 = vunpcklpd_avx(auVar8,auVar31);
        auVar25._0_8_ = auVar8._0_8_ * auVar6._0_8_;
        auVar25._8_8_ = auVar8._8_8_ * auVar6._8_8_;
        dVar38 = (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                 array[5] +
                 (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                 array[7];
        auVar34._8_8_ = 0;
        auVar34._0_8_ = dVar38;
        auVar8 = vandpd_avx(auVar34,auVar30);
        auVar11._8_8_ = 0;
        auVar11._0_8_ = dVar7 * (dVar38 / auVar8._0_8_);
        auVar29 = vunpcklpd_avx(auVar5,auVar11);
      }
      goto LAB_002946f6;
    }
    auVar28._8_8_ = 0x7fffffffffffffff;
    auVar28._0_8_ = 0x7fffffffffffffff;
    auVar18 = vpermilpd_avx(*(undefined1 (*) [16])
                             ((R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array + 2),1);
    auVar6 = vunpcklpd_avx(auVar5,auVar6);
    dVar38 = (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[5] -
             (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[7];
    auVar22._8_8_ = 0;
    auVar22._0_8_ = dVar38;
    auVar5 = vandpd_avx(auVar22,auVar28);
    auVar32._8_8_ = 0;
    auVar32._0_8_ =
         (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
    ;
    auVar8 = vunpcklpd_avx(auVar32,*(undefined1 (*) [16])
                                    ((R->
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                     m_storage.m_data.array + 6));
    auVar33._0_8_ = auVar8._0_8_ + auVar18._0_8_;
    auVar33._8_8_ = auVar8._8_8_ + auVar18._8_8_;
    auVar8 = vandpd_avx(auVar33,auVar28);
    auVar8 = vdivpd_avx(auVar33,auVar8);
    auVar23._8_8_ = 0;
    auVar23._0_8_ = dVar36 * (dVar38 / auVar5._0_8_);
    auVar25 = vunpcklpd_avx(auVar23,auVar31);
  }
  else {
    auVar27._8_8_ = 0x7fffffffffffffff;
    auVar27._0_8_ = 0x7fffffffffffffff;
    auVar6 = vunpcklpd_avx(auVar5,auVar6);
    dVar7 = (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
            [5] - (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                  .array[7];
    auVar20._8_8_ = 0;
    auVar20._0_8_ = dVar7;
    auVar5 = vandpd_avx(auVar20,auVar27);
    dVar38 = dVar38 * (dVar7 / auVar5._0_8_);
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage
    .m_data.array[1] = dVar38;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = dVar38;
    auVar25 = vunpcklpd_avx(auVar8,auVar21);
    auVar5 = vmovhpd_avx(*(undefined1 (*) [16])
                          ((R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array + 6),
                         (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                         .m_data.array[1]);
    auVar8 = vsubpd_avx(auVar5,*(undefined1 (*) [16])
                                ((R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                 m_storage.m_data.array + 2));
    auVar5 = vandpd_avx(auVar8,auVar27);
    auVar8 = vdivpd_avx(auVar8,auVar5);
  }
  auVar29._0_8_ = auVar6._0_8_ * auVar8._0_8_;
  auVar29._8_8_ = auVar6._8_8_ * auVar8._8_8_;
LAB_002946f6:
  auVar9._0_8_ = auVar25._0_8_ * auVar25._0_8_;
  auVar9._8_8_ = auVar25._8_8_ * auVar25._8_8_;
  auVar5 = vshufpd_avx(auVar29,auVar29,1);
  auVar8 = vshufpd_avx(auVar9,auVar9,1);
  auVar8 = vfmadd231sd_fma(auVar8,auVar25,auVar25);
  auVar8 = vfmadd231sd_fma(auVar8,auVar29,auVar29);
  auVar5 = vfmadd213sd_fma(auVar5,auVar5,auVar8);
  auVar5 = vsqrtsd_avx(auVar5,auVar5);
  auVar10._0_8_ = auVar5._0_8_;
  auVar10._8_8_ = auVar10._0_8_;
  auVar5 = vdivpd_avx(auVar25,auVar10);
  auVar8 = vdivpd_avx(auVar29,auVar10);
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.
   m_data.array = auVar5;
  *(undefined1 (*) [16])
   ((__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage
    .m_data.array + 2) = auVar8;
  return __return_storage_ptr__;
}

Assistant:

opengv::quaternion_t
opengv::math::rot2quaternion( const rotation_t & R )
{
  quaternion_t q;
    
  q[0] = ( R(0,0) + R(1,1) + R(2,2) + 1.0) / 4.0;
  q[1] = ( R(0,0) - R(1,1) - R(2,2) + 1.0) / 4.0;
  q[2] = (-R(0,0) + R(1,1) - R(2,2) + 1.0) / 4.0;
  q[3] = (-R(0,0) - R(1,1) + R(2,2) + 1.0) / 4.0;
  if(q[0] < 0.0) q[0] = 0.0;
  if(q[1] < 0.0) q[1] = 0.0;
  if(q[2] < 0.0) q[2] = 0.0;
  if(q[3] < 0.0) q[3] = 0.0;
  q[0] = sqrt(q[0]);
  q[1] = sqrt(q[1]);
  q[2] = sqrt(q[2]);
  q[3] = sqrt(q[3]);
  if(q[0] >= q[1] && q[0] >= q[2] && q[0] >= q[3])
  {
    q[0] *= +1.0;
    q[1] *= ((R(2,1)-R(1,2))/fabs(R(2,1)-R(1,2)));
    q[2] *= ((R(0,2)-R(2,0))/fabs(R(0,2)-R(2,0)));
    q[3] *= ((R(1,0)-R(0,1))/fabs(R(1,0)-R(0,1)));
  }
  else if(q[1] >= q[0] && q[1] >= q[2] && q[1] >= q[3])
  {
    q[0] *= ((R(2,1)-R(1,2))/fabs(R(2,1)-R(1,2)));
    q[1] *= +1.0;
    q[2] *= ((R(1,0)+R(0,1))/fabs(R(1,0)+R(0,1)));
    q[3] *= ((R(0,2)+R(2,0))/fabs(R(0,2)+R(2,0)));
  }
  else if(q[2] >= q[0] && q[2] >= q[1] && q[2] >= q[3])
  {
    q[0] *= ((R(0,2)-R(2,0))/fabs(R(0,2)-R(2,0)));
    q[1] *= ((R(1,0)+R(0,1))/fabs(R(1,0)+R(0,1)));
    q[2] *= +1.0;
    q[3] *= ((R(2,1)+R(1,2))/fabs(R(2,1)+R(1,2)));
  }
  else if(q[3] >= q[0] && q[3] >= q[1] && q[3] >= q[2])
  {
    q[0] *= ((R(1,0)-R(0,1))/fabs(R(1,0)-R(0,1)));
    q[1] *= ((R(2,0)+R(0,2))/fabs(R(2,0)+R(0,2)));
    q[2] *= ((R(2,1)+R(1,2))/fabs(R(2,1)+R(1,2)));  
    q[3] *= +1.0;
  }
  else
    {};/*std::cout << "quaternion error" << std::endl;*/
  
  double scale = sqrt(q[0]*q[0]+q[1]*q[1]+q[2]*q[2]+q[3]*q[3]);
  q[0] /= scale;
  q[1] /= scale;
  q[2] /= scale;
  q[3] /= scale;
  
  return q;
}